

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  ushort uVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  _Alloc_hider _Var6;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  double value;
  Char buffer [33];
  LargestInt local_d0;
  string local_c8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ValueHolder local_58;
  undefined4 local_50;
  CommentInfo *local_48;
  ptrdiff_t pStack_40;
  ptrdiff_t local_38;
  
  local_d0 = 0;
  __n = (long)token->end_ - (long)token->start_;
  if ((long)__n < 0) {
    paVar7 = &local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Unable to parse token length","");
    addError(this,&local_c8,token,(Location)0x0);
    _Var6._M_p = local_c8._M_dataplus._M_p;
  }
  else {
    if ((long)__n < 0x21) {
      memcpy(&local_c8,token->start_,__n);
      *(undefined1 *)((long)&local_c8 + __n) = 0;
      iVar2 = __isoc99_sscanf(&local_c8,&DAT_001222c6,&local_d0);
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8);
      iVar2 = __isoc99_sscanf(local_c8._M_dataplus._M_p,&DAT_001222c6,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
    }
    if (iVar2 == 1) {
      uVar1 = *(ushort *)&decoded->field_0x8;
      *(ushort *)&decoded->field_0x8 = uVar1 & 0xff00 | 3;
      local_58 = decoded->value_;
      (decoded->value_).int_ = local_d0;
      *(ushort *)&decoded->field_0x8 = uVar1 & 0xfe00 | 3;
      local_50 = CONCAT22((short)((uint)local_50 >> 0x10),
                          uVar1 & 0x100 | uVar1 & 0xff | (ushort)local_50 & 0xfe00);
      local_48 = decoded->comments_;
      decoded->comments_ = (CommentInfo *)0x0;
      pStack_40 = decoded->start_;
      decoded->start_ = 0;
      local_38 = decoded->limit_;
      decoded->limit_ = 0;
      Value::~Value((Value *)&local_58);
      return true;
    }
    paVar7 = &local_68;
    local_78[0] = paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,token->start_,token->end_);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x1222a7);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_88 = *plVar4;
      lStack_80 = plVar3[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar4;
      local_98 = (long *)*plVar3;
    }
    local_90 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_c8.field_2._M_allocated_capacity = *psVar5;
      local_c8.field_2._8_8_ = plVar3[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar5;
      local_c8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_c8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    addError(this,&local_c8,token,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    _Var6._M_p = (pointer)local_78[0];
    if (local_98 != &local_88) {
      operator_delete(local_98);
      _Var6._M_p = (pointer)local_78[0];
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar7) {
    operator_delete(_Var6._M_p);
  }
  return false;
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  ptrdiff_t const length = token.end_ - token.start_;

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }
  size_t const ulength = static_cast<size_t>(length);

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, ulength);
    buffer[length] = 0;
    count = sscanf(buffer, format, &value);
  } else {
    JSONCPP_STRING buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError("'" + JSONCPP_STRING(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}